

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::load(XMLLoader *this,FileName *fileName,AffineSpace3fa *space,SharedState *state)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Node *pNVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  XMLLoader loader;
  key_type local_118;
  XMLLoader local_f8;
  
  this_00 = &state->sceneMap;
  paVar1 = &local_f8.path.filename.field_2;
  pcVar2 = (fileName->filename)._M_dataplus._M_p;
  local_f8.path.filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar2,pcVar2 + (fileName->filename)._M_string_length);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
          ::find(&this_00->_M_t,(key_type *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.path.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.path.filename._M_dataplus._M_p);
  }
  if ((_Rb_tree_header *)iVar4._M_node == &(state->sceneMap)._M_t._M_impl.super__Rb_tree_header) {
    XMLLoader(&local_f8,fileName,space,state);
    pcVar2 = (fileName->filename)._M_dataplus._M_p;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,pcVar2,pcVar2 + (fileName->filename)._M_string_length);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
             ::operator[](this_00,&local_118);
    if (local_f8.root.ptr != (Node *)0x0) {
      (*((local_f8.root.ptr)->super_RefCount)._vptr_RefCount[2])();
    }
    if (pmVar5->ptr != (Node *)0x0) {
      (*(pmVar5->ptr->super_RefCount)._vptr_RefCount[3])();
    }
    pmVar5->ptr = local_f8.root.ptr;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    (this->path).filename._M_dataplus._M_p = (pointer)local_f8.root.ptr;
    if (local_f8.root.ptr != (Node *)0x0) {
      (*((local_f8.root.ptr)->super_RefCount)._vptr_RefCount[2])();
    }
    ~XMLLoader(&local_f8);
  }
  else {
    paVar1 = &local_f8.path.filename.field_2;
    pcVar2 = (fileName->filename)._M_dataplus._M_p;
    local_f8.path.filename._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,pcVar2,pcVar2 + (fileName->filename)._M_string_length);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
             ::operator[](this_00,(key_type *)&local_f8);
    pNVar3 = pmVar5->ptr;
    (this->path).filename._M_dataplus._M_p = (pointer)pNVar3;
    if (pNVar3 != (Node *)0x0) {
      (*(pNVar3->super_RefCount)._vptr_RefCount[2])();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.path.filename._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8.path.filename._M_dataplus._M_p);
    }
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::load(const FileName& fileName, const AffineSpace3fa& space, SharedState& state)
  {
    if (state.sceneMap.find(fileName) != state.sceneMap.end())
      return state.sceneMap[fileName];

    XMLLoader loader(fileName,space,state);
    state.sceneMap[fileName] = loader.root;
    return loader.root;
  }